

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

Grammar * __thiscall
xercesc_4_0::DOMLSParserImpl::loadGrammar
          (DOMLSParserImpl *this,char *systemId,GrammarType grammarType,bool toCache)

{
  Grammar *pGVar1;
  DOMException *this_00;
  ResetParseType resetParse;
  JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl> local_28;
  
  if ((this->super_AbstractDOMParser).fParseInProgress != true) {
    local_28.fToCall = (MFPT)DOMLSParserImpl::resetParse;
    local_28._16_8_ = 0;
    (this->super_AbstractDOMParser).fParseInProgress = true;
    if (grammarType == DTDGrammarType) {
      ((this->super_AbstractDOMParser).fScanner)->fDocTypeHandler = (DocTypeHandler *)0x0;
    }
    local_28.fObject = this;
    pGVar1 = XMLScanner::loadGrammar
                       ((this->super_AbstractDOMParser).fScanner,systemId,(short)grammarType,toCache
                       );
    JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl>::~JanitorMemFunCall(&local_28);
    return pGVar1;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

Grammar* DOMLSParserImpl::loadGrammar(const char* const systemId,
                                     const Grammar::GrammarType grammarType,
                                     const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &DOMLSParserImpl::resetParse);

	Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}